

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint64_t DoBenchmark(Function ToBenchmark,uint64_t Size)

{
  string sVar1;
  uint64_t uVar2;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  result_type_conflict1 in_stack_ffffffffffffff54;
  string *this;
  Function p_Var3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_98;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_88;
  time_point stop;
  string local_70 [32];
  string local_50;
  ulong local_30;
  uint64_t Counter;
  time_point start;
  uniform_int_distribution<int> RandomChar;
  uint64_t Size_local;
  Function ToBenchmark_local;
  
  CreateFile(Size);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&start,0,(int)Size + -1);
  Counter = std::chrono::_V2::system_clock::now();
  for (local_30 = 0; local_30 < 1000; local_30 = local_30 + 1) {
    this = local_70;
    p_Var3 = ToBenchmark;
    std::__cxx11::string::string(this,(string *)&filename_abi_cxx11_);
    sVar1._M_string_length._0_4_ = in_stack_ffffffffffffff50;
    sVar1._0_8_ = in_stack_ffffffffffffff48;
    sVar1._M_string_length._4_4_ = in_stack_ffffffffffffff54;
    sVar1.field_2._M_allocated_capacity = (size_type)this;
    sVar1.field_2._8_8_ = p_Var3;
    (*p_Var3)(&local_50,sVar1);
    in_stack_ffffffffffffff54 =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)&start,&Generator);
    in_stack_ffffffffffffff48 = std::__cxx11::string::operator[]((ulong)&local_50);
    std::__cxx11::string::push_back('h');
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
  }
  local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_98.__r = (rep)std::chrono::operator-
                                (&local_88,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&Counter);
  local_90.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_98);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_90);
  return uVar2;
}

Assistant:

uint64_t DoBenchmark(Function ToBenchmark, uint64_t Size)
{
    CreateFile(Size);
    std::uniform_int_distribution<> RandomChar(0,Size-1);
    auto start = std::chrono::high_resolution_clock::now();
    for(uint64_t Counter = 0; Counter < TestIterations; Counter++)
    {
        HardToOptimizeOutResultsStorage.push_back(
            ToBenchmark(filename)[RandomChar(Generator)]
        );
    }
    auto stop = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(stop-start).count();
    CreateFile(0);
}